

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_key_derivation_setup(psa_key_derivation_operation_t *operation,psa_algorithm_t alg)

{
  psa_status_t pVar1;
  uint kdf_alg;
  
  if (operation->alg != 0) {
    return -0x89;
  }
  pVar1 = -0x87;
  if ((alg & 0x7f03ffff) != 0x30000000) {
    if ((alg & 0x7f000000) == 0x30000000) {
      kdf_alg = alg & 0x2003ffff;
    }
    else {
      kdf_alg = alg;
      if ((alg & 0x7f000000) != 0x20000000) {
        return -0x87;
      }
    }
    pVar1 = psa_key_derivation_setup_kdf(operation,kdf_alg);
    if (pVar1 == 0) {
      operation->alg = alg;
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_key_derivation_setup( psa_key_derivation_operation_t *operation,
                                       psa_algorithm_t alg )
{
    psa_status_t status;

    if( operation->alg != 0 )
        return( PSA_ERROR_BAD_STATE );

    if( PSA_ALG_IS_RAW_KEY_AGREEMENT( alg ) )
        return( PSA_ERROR_INVALID_ARGUMENT );
    else if( PSA_ALG_IS_KEY_AGREEMENT( alg ) )
    {
        psa_algorithm_t kdf_alg = PSA_ALG_KEY_AGREEMENT_GET_KDF( alg );
        status = psa_key_derivation_setup_kdf( operation, kdf_alg );
    }
    else if( PSA_ALG_IS_KEY_DERIVATION( alg ) )
    {
        status = psa_key_derivation_setup_kdf( operation, alg );
    }
    else
        return( PSA_ERROR_INVALID_ARGUMENT );

    if( status == PSA_SUCCESS )
        operation->alg = alg;
    return( status );
}